

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O1

void __thiscall
Assimp::D3MF::D3MFExporter::D3MFExporter(D3MFExporter *this,char *pFile,aiScene *pScene)

{
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,pFile,&local_21);
  this->m_zipArchive = (zip_t *)0x0;
  this->mScene = pScene;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mModelOutput);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mRelOutput);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mContentOutput);
  (this->mRelations).
  super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRelations).
  super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mRelations).
  super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

D3MFExporter::D3MFExporter( const char* pFile, const aiScene* pScene )
: mArchiveName( pFile )
, m_zipArchive( nullptr )
, mScene( pScene )
, mModelOutput()
, mRelOutput()
, mContentOutput()
, mBuildItems()
, mRelations() {
    // empty
}